

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLinLin>
::ShadedRenderer(ShadedRenderer<ImPlot::GetterXsYs<double>,_ImPlot::GetterXsYRef<double>,_ImPlot::TransformerLinLin>
                 *this,GetterXsYs<double> *getter1,GetterXsYRef<double> *getter2,
                TransformerLinLin *transformer,ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  ImVec2 IVar3;
  ImVec2 IVar4;
  ImPlotContext *pIVar5;
  int iVar6;
  long lVar7;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar6 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar6 = iVar2;
  }
  this->Prims = iVar6 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar5 = GImPlot;
  (this->P12).y = 0.0;
  lVar7 = (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride;
  iVar2 = transformer->YAxis;
  IVar1 = GImPlot->PixelRange[iVar2].Min;
  IVar3.y = (float)(GImPlot->My[iVar2] *
                    (*(double *)((long)getter1->Ys + lVar7) -
                    GImPlot->CurrentPlot->YAxis[iVar2].Range.Min) + (double)IVar1.y);
  IVar3.x = (float)(GImPlot->Mx *
                    (*(double *)((long)getter1->Xs + lVar7) -
                    (GImPlot->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  this->P11 = IVar3;
  iVar2 = getter2->Count;
  iVar6 = transformer->YAxis;
  IVar1 = pIVar5->PixelRange[iVar6].Min;
  IVar4.y = (float)(pIVar5->My[iVar6] *
                    (getter2->YRef - pIVar5->CurrentPlot->YAxis[iVar6].Range.Min) + (double)IVar1.y)
  ;
  IVar4.x = (float)(pIVar5->Mx *
                    (*(double *)
                      ((long)getter2->Xs +
                      (long)((getter2->Offset % iVar2 + iVar2) % iVar2) * (long)getter2->Stride) -
                    (pIVar5->CurrentPlot->XAxis).Range.Min) + (double)IVar1.x);
  this->P12 = IVar4;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }